

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car.cpp
# Opt level: O0

void __thiscall Car::set_xpos(Car *this,int x)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lck;
  int x_local;
  Car *this_local;
  
  lck._M_device._4_4_ = x;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mtx);
  this->_xpos = lck._M_device._4_4_;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void Car::set_xpos(int x){
        std::lock_guard lck(mtx);
        _xpos = x;
    }